

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall tchecker::syncprod::system_t::compute_labels(system_t *this)

{
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  pointer psVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pdVar4;
  pointer __s;
  pointer puVar5;
  long *plVar6;
  pointer pbVar7;
  bool bVar8;
  locations_identifiers_range_t lVar9;
  invalid_argument *this_01;
  ulong uVar10;
  string *psVar11;
  locations_identifiers_range_t lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string *psVar14;
  string *l;
  pointer name;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar15;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  locations_identifiers_range_t local_58;
  ulong local_50;
  size_type local_48;
  string *local_40;
  key_type *local_38;
  
  lVar9 = tchecker::system::locs_t::locations_identifiers(&(this->super_system_t).super_locs_t);
  local_50 = (ulong)lVar9 >> 0x20;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar12 = lVar9;
  if (lVar9._begin._current._current != lVar9._end._current._current) {
    local_58 = lVar9;
    do {
      uVar10 = (ulong)lVar9 & 0xffffffff;
      psVar1 = (this->super_system_t).super_locs_t._locs.
               super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_system_t).super_locs_t._locs.
                        super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar10)
      goto LAB_0011c4bd;
      lVar2 = (long)psVar1[uVar10].
                    super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (lVar9._begin._current._current != *(int *)(lVar2 + 4)) goto LAB_0011c49e;
      p_Var3 = psVar1[uVar10].
               super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"labels","");
      rVar15 = tchecker::system::attributes_t::range((attributes_t *)(lVar2 + 0x28),&local_98);
      labels_from_attrs((syncprod *)
                        rVar15._begin.super_const_iterator.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                        ._M_cur.super_const_iterator,
                        (range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
                         *)rVar15._end.super_const_iterator.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                           ._M_cur.super_const_iterator,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      lVar12 = local_58;
      pbVar7 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar9._begin._current = lVar9._begin._current._current + 1;
      lVar9._end._current = 0;
    } while ((uint)local_50 != lVar9._begin._current);
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      name = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar8 = labels_t::is_label(&this->super_labels_t,name);
        if (!bVar8) {
          labels_t::add_label(&this->super_labels_t,name);
        }
        name = name + 1;
      } while (name != pbVar7);
    }
  }
  uVar10 = *(stored_size_type *)
            ((long)&(this->super_labels_t)._labels_index._key_map.m_flat_tree.m_data.m_seq.m_holder
            + 8);
  if (uVar10 != *(stored_size_type *)
                 ((long)&(this->super_labels_t)._labels_index._value_map.m_flat_tree.m_data.m_seq.
                         m_holder + 8)) {
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x90,
                  "size_t tchecker::index_t<std::basic_string<char>, unsigned int>::size() const [KEY = std::basic_string<char>, T = unsigned int]"
                 );
  }
  this_00 = &this->_labels;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(this_00,(this->_labels).
                            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,(long)(this->super_system_t).super_locs_t._locs.
                         super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_system_t).super_locs_t._locs.
                         super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (lVar12._begin._current._current != (uint)local_50) {
    local_38 = (key_type *)&this->super_labels_t;
    local_48 = uVar10 & 0xffffffff;
    do {
      lVar9 = (locations_identifiers_range_t)((ulong)lVar12 & 0xffffffff);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((this_00->
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)lVar9,local_48,false);
      pdVar4 = (this_00->
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __s = *(pointer *)
             &pdVar4[(long)lVar9].m_bits.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      puVar5 = *(pointer *)
                ((long)&pdVar4[(long)lVar9].m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                8);
      if (__s != puVar5) {
        memset(__s,0,(long)puVar5 - (long)__s & 0xfffffffffffffff8);
      }
      psVar1 = (this->super_system_t).super_locs_t._locs.
               super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_system_t).super_locs_t._locs.
                        super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
          (ulong)lVar9) {
LAB_0011c4bd:
        __assert_fail("id < _locs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                      ,0xc3,
                      "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                     );
      }
      lVar2 = (long)psVar1[(long)lVar9].
                    super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58 = lVar9;
      if (*(int *)(lVar2 + 4) != lVar12._begin._current._current) {
LAB_0011c49e:
        __assert_fail("_locs[id]->id() == id",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                      ,0xc4,
                      "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                     );
      }
      p_Var3 = psVar1[(long)lVar9].
               super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      pbVar7 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_40 = local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        paVar13 = &(local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar6 = (long *)(((string *)(paVar13 + -1))->_M_dataplus)._M_p;
          if (paVar13 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar6) {
            operator_delete(plVar6,paVar13->_M_allocated_capacity + 1);
          }
          psVar14 = (string *)(paVar13 + 1);
          paVar13 = paVar13 + 2;
        } while (psVar14 != pbVar7);
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_40;
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"labels","");
      rVar15 = tchecker::system::attributes_t::range((attributes_t *)(lVar2 + 0x28),&local_98);
      labels_from_attrs((syncprod *)
                        rVar15._begin.super_const_iterator.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                        ._M_cur.super_const_iterator,
                        (range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
                         *)rVar15._end.super_const_iterator.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                           ._M_cur.super_const_iterator,&local_78);
      psVar11 = local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar14 = local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        psVar11 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar14 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; psVar11 != psVar14; psVar11 = psVar11 + 1) {
        pdVar4 = (this_00->
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)&local_98,local_38);
        if (local_98._M_dataplus._M_p ==
            (pointer)(*(stored_size_type *)
                       ((long)&(this->super_labels_t)._labels_index._key_map.m_flat_tree.m_data.
                               m_seq.m_holder + 8) * 0x28 +
                     (long)(this->super_labels_t)._labels_index._key_map.m_flat_tree.m_data.m_seq.
                           m_holder.m_start)) {
          this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this_01,"key is not indexed");
          __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (pdVar4 + (long)lVar9,(ulong)*(uint *)(local_98._M_dataplus._M_p + 0x20),true);
      }
      lVar12._begin._current = local_58._begin._current._current + 1;
      lVar12._end._current = 0;
    } while (lVar12._begin._current != (uint)local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void system_t::compute_labels()
{
  tchecker::system::locs_t::locations_identifiers_range_t const locations_identifiers = this->locations_identifiers();

  // Compute labels index
  std::vector<std::string> labels;
  for (tchecker::loc_id_t const loc_id : locations_identifiers) {
    auto const & attr = tchecker::syncprod::system_t::location(loc_id)->attributes();
    labels_from_attrs(attr.range("labels"), labels);
  }

  for (std::string const & l : labels) {
    if (!tchecker::syncprod::labels_t::is_label(l))
      tchecker::syncprod::labels_t::add_label(l);
  }

  // Set location labels
  tchecker::label_id_t const & labels_count = this->labels_count();

  _labels.clear();
  _labels.resize(this->locations_count());

  for (tchecker::loc_id_t const loc_id : locations_identifiers) {
    _labels[loc_id].resize(labels_count);
    _labels[loc_id].reset();
    auto const & attr = tchecker::syncprod::system_t::location(loc_id)->attributes();
    labels.clear();
    labels_from_attrs(attr.range("labels"), labels);
    for (std::string const & l : labels)
      _labels[loc_id].set(this->label_id(l));
  }
}